

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O0

RGB __thiscall pbrt::PixelSensor::IlluminantToSensorRGB(PixelSensor *this,SpectrumHandle *illum)

{
  undefined8 uVar1;
  SpectrumHandle *in_RSI;
  Float r;
  Float g;
  Float b;
  undefined1 auVar3 [56];
  RGB RVar4;
  RGB rgb;
  DenselySampledSpectrum *in_stack_ffffffffffffff28;
  SpectrumHandle *this_00;
  Float a;
  RGB *this_01;
  SpectrumHandle *in_stack_ffffffffffffff48;
  SpectrumHandle *b_00;
  SpectrumHandle local_50;
  RGB local_48;
  SpectrumHandle local_38;
  RGB local_2c [3];
  undefined1 auVar2 [64];
  
  this_00 = &local_38;
  SpectrumHandle::SpectrumHandle(this_00,(SpectrumHandle *)in_stack_ffffffffffffff28);
  a = (Float)((ulong)&local_48.b >> 0x20);
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (this_00,in_stack_ffffffffffffff28);
  r = InnerProduct(in_RSI,in_stack_ffffffffffffff48);
  this_01 = &local_48;
  SpectrumHandle::SpectrumHandle(this_00,(SpectrumHandle *)in_stack_ffffffffffffff28);
  b_00 = &local_50;
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (this_00,in_stack_ffffffffffffff28);
  g = InnerProduct(in_RSI,b_00);
  SpectrumHandle::SpectrumHandle(this_00,(SpectrumHandle *)in_stack_ffffffffffffff28);
  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
            (this_00,in_stack_ffffffffffffff28);
  b = InnerProduct(in_RSI,b_00);
  RGB::RGB(local_2c,r,g,b);
  auVar3 = (undefined1  [56])0x0;
  RVar4 = RGB::operator/(this_01,a);
  auVar2._0_8_ = RVar4._0_8_;
  auVar2._8_56_ = auVar3;
  uVar1 = vmovlpd_avx(auVar2._0_16_);
  RVar4.b = RVar4.b;
  RVar4.r = (Float)(int)uVar1;
  RVar4.g = (Float)(int)((ulong)uVar1 >> 0x20);
  return RVar4;
}

Assistant:

RGB IlluminantToSensorRGB(SpectrumHandle illum) const {
        RGB rgb(InnerProduct(illum, &r_bar), InnerProduct(illum, &g_bar),
                InnerProduct(illum, &b_bar));
        return rgb / rgb.g;
    }